

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_indexer.hpp
# Opt level: O2

void set_reference_points<ExtIsoForest,double,long>
               (TreesIndexer *indexer,ExtIsoForest *model,bool with_distances,double *numeric_data,
               int *categ_data,bool is_col_major,size_t ld_numeric,size_t ld_categ,double *Xc,
               long *Xc_ind,long *Xc_indptr,double *Xr,long *Xr_ind,long *Xr_indptr,size_t nrows,
               int nthreads)

{
  ulong uVar1;
  pointer pSVar2;
  pointer puVar3;
  iterator __begin2;
  pointer pSVar4;
  long lVar5;
  __uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true> output_depths;
  ulong uVar6;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  long lVar7;
  long lVar8;
  unique_ptr<long[],_std::default_delete<long[]>_> node_indices_predict;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  
  pSVar4 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pSVar4 == (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
     ((with_distances &&
      ((pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    build_tree_indices(indexer,model,nthreads,with_distances);
    pSVar4 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if ((pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pSVar2 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; pSVar4 != pSVar2; pSVar4 = pSVar4 + 1) {
      puVar3 = (pSVar4->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      puVar3 = (pSVar4->reference_indptr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_indptr).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (pSVar4->reference_indptr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      puVar3 = (pSVar4->reference_mapping).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_mapping).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (pSVar4->reference_mapping).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
    }
  }
  lVar5 = ((long)(model->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(model->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar1 = nrows * 8;
  output_depths.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
       operator_new__(-(ulong)(nrows >> 0x3d != 0) | uVar1);
  uVar6 = lVar5 * nrows;
  ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       output_depths.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  node_indices_predict._M_t.super___uniq_ptr_impl<long,_std::default_delete<long[]>_>._M_t.
  super__Tuple_impl<0UL,_long_*,_std::default_delete<long[]>_>.super__Head_base<0UL,_long_*,_false>.
  _M_head_impl = (__uniq_ptr_data<long,_std::default_delete<long[]>,_true,_true>)
                 operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
  predict_iforest<double,long>
            (numeric_data,categ_data,is_col_major,ld_numeric,ld_categ,Xc,Xc_ind,Xc_indptr,Xr,Xr_ind,
             Xr_indptr,nrows,nthreads,false,(IsoForest *)0x0,model,
             (double *)
             output_depths.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,
             (long *)node_indices_predict._M_t.
                     super___uniq_ptr_impl<long,_std::default_delete<long[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_*,_std::default_delete<long[]>_>.
                     super__Head_base<0UL,_long_*,_false>._M_head_impl,(double *)0x0,indexer);
  lVar7 = 0;
  std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
            ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&ignored,(pointer)0x0);
  lVar5 = lVar5 + 1;
  lVar8 = 0x48;
  while (lVar5 = lVar5 + -1, lVar5 != 0) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<long*>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((long)&(((indexer->indices).
                         super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                         _M_impl.super__Vector_impl_data._M_start)->terminal_node_mappings).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar8),
               (long)node_indices_predict._M_t.
                     super___uniq_ptr_impl<long,_std::default_delete<long[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_*,_std::default_delete<long[]>_>.
                     super__Head_base<0UL,_long_*,_false>._M_head_impl + lVar7,
               (long)node_indices_predict._M_t.
                     super___uniq_ptr_impl<long,_std::default_delete<long[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_*,_std::default_delete<long[]>_>.
                     super__Head_base<0UL,_long_*,_false>._M_head_impl + lVar7 + uVar1);
    lVar7 = lVar7 + uVar1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(((indexer->indices).
                         super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                         _M_impl.super__Vector_impl_data._M_start)->terminal_node_mappings).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar8));
    build_ref_node((SingleTreeIndex *)
                   ((long)(indexer->indices).
                          super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48));
    lVar8 = lVar8 + 0x98;
  }
  std::unique_ptr<long[],_std::default_delete<long[]>_>::~unique_ptr(&node_indices_predict);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&ignored);
  return;
}

Assistant:

void set_reference_points(TreesIndexer &indexer, Model &model, const bool with_distances,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                          size_t nrows, int nthreads)
{
    if (indexer.indices.empty() || (with_distances && indexer.indices.front().node_distances.empty()))
    {
        build_tree_indices(indexer, model, nthreads, with_distances);
    }

    if (!indexer.indices.front().reference_points.empty())
    {
        for (auto &tree : indexer.indices)
        {
            tree.reference_points.clear();
            tree.reference_indptr.clear();
            tree.reference_mapping.clear();
        }
    }


    size_t ntrees = get_ntrees(model);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    std::unique_ptr<sparse_ix[]> node_indices_predict(new sparse_ix[nrows * ntrees]);
    void *model_ptr = (std::is_same<Model, IsoForest>::value)? &model : NULL;
    void *model_ext_ptr = (std::is_same<Model, ExtIsoForest>::value)? &model : NULL;
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    Xc, Xc_ind, Xc_indptr,
                    Xr, Xr_ind, Xr_indptr,
                    nrows, nthreads, false,
                    (IsoForest*)model_ptr, (ExtIsoForest*)model_ext_ptr,
                    ignored.get(), node_indices_predict.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
            shared(indexer, node_indices_predict, ntrees)
    for (size_t_for tree = 0; tree < (decltype(tree))ntrees; tree++)
    {
        indexer.indices[tree].reference_points.assign(node_indices_predict.get() + tree*nrows,
                                                      node_indices_predict.get() + (tree+1)*nrows);
        indexer.indices[tree].reference_points.shrink_to_fit();
        build_ref_node(indexer.indices[tree]);
    }
}